

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O2

double bench_sched_perf(size_t ntasks)

{
  double dVar1;
  pointer pdVar2;
  ostream *poVar3;
  double *pdVar4;
  double dVar5;
  double local_38;
  
  local_38 = 0.0;
  if (!OnlyParallelRun) {
    if (!ClearCaches) {
      bench_parallel_time(ntasks,1);
    }
    local_38 = bench_serial_time(ntasks,NReps);
    pdVar2 = TSeq.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (Verbosity != 0) {
      pdVar4 = TSeq.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (1 < Verbosity) {
        for (; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
          dVar5 = *pdVar4;
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 8;
          poVar3 = std::ostream::_M_insert<double>(dVar5);
          std::operator<<(poVar3,' ');
        }
      }
      std::operator<<((ostream *)&std::cout,"  serial time=");
      poVar3 = std::ostream::_M_insert<double>(local_38);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  dVar5 = bench_parallel_time(ntasks,NReps);
  pdVar2 = TPar.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (Verbosity != 0) {
    pdVar4 = TPar.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < Verbosity) {
      for (; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
        dVar1 = *pdVar4;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             8;
        poVar3 = std::ostream::_M_insert<double>(dVar1);
        std::operator<<(poVar3,' ');
      }
    }
    std::operator<<((ostream *)&std::cout,"parallel time=");
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (OnlyParallelRun == false) {
    if ((UseSameTile == false) && (ParallelBaseline == false)) {
      local_38 = local_38 / (double)Nthreads;
    }
    dVar5 = dVar5 / local_38;
  }
  else {
    dVar5 = 1.0;
  }
  return dVar5;
}

Assistant:

double bench_sched_perf(const size_t ntasks)
{ double serial_time = 0.;
  
  if (!OnlyParallelRun) {
    
    // heat the caches if they are not going to be cleaned.
    //It is not done in profiling runs because of the runtime impact
    if (!ClearCaches) {
      bench_parallel_time(ntasks, 1);
    }
    
    serial_time = bench_serial_time(ntasks, NReps);
    if(Verbosity) {
      if (Verbosity > 1) {
        for (double t : TSeq) {
          std::cout << std::setw(8) << t << ' ';
        }
      }
      std::cout << "  serial time=" << serial_time << std::endl;
    }
  }

  const double parallel_time = bench_parallel_time(ntasks, NReps);
  if(Verbosity) {
    if (Verbosity > 1) {
      for (double t : TPar) {
        std::cout << std::setw(8) << t << ' ';
      }
    }
    std::cout << "parallel time=" << parallel_time << std::endl;
  }
  
  if (OnlyParallelRun) {
    return 1.0;
  } else {
    // if UseSameTile the runtime cannot scale linearly, and if ParallelBaseline we just want a one-to-one comparison
    //So only in sequential baselines with different tiles do we compare with the theoretical Time/Nthreads scaling
    const double baseline_time = (UseSameTile || ParallelBaseline) ? serial_time : (serial_time / Nthreads);
    return parallel_time / baseline_time;
  }
}